

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
deqp::gls::LifetimeTests::details::createLifeTestGroup
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx,LifeTestSpec *spec,
          vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
          *types)

{
  Type *pTVar1;
  TestContext *pTVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  TestNode *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestBase *this_00;
  pointer ppTVar6;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,spec->name,spec->name);
  (__return_storage_ptr__->
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data.ptr =
       (TestCaseGroup *)this;
  ppTVar6 = (types->
            super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppTVar6 ==
        (types->
        super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return __return_storage_ptr__;
    }
    pTVar1 = *ppTVar6;
    iVar4 = (*pTVar1->_vptr_Type[7])(pTVar1);
    if (spec->needBind == true) {
      iVar5 = (*pTVar1->_vptr_Type[6])(pTVar1);
      if (CONCAT44(extraout_var_00,iVar5) != 0) goto LAB_017f944e;
    }
    else {
LAB_017f944e:
      this_00 = (TestBase *)operator_new(0xc0);
      pTVar2 = (TestContext *)spec->func;
      pcVar3 = *(pointer *)&spec->field_0x10;
      TestBase::TestBase(this_00,(char *)CONCAT44(extraout_var,iVar4),
                         (char *)CONCAT44(extraout_var,iVar4),&(pTVar1->super_ContextWrapper).m_ctx)
      ;
      (this_00->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestBase_0217a560;
      this_00[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pTVar1;
      this_00[1].super_TestCase.super_TestNode.m_testCtx = pTVar2;
      this_00[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = pcVar3;
      tcu::TestNode::addChild(this,(TestNode *)this_00);
    }
    ppTVar6 = ppTVar6 + 1;
  } while( true );
}

Assistant:

MovePtr<TestCaseGroup> createLifeTestGroup (TestContext& testCtx,
											const LifeTestSpec& spec,
											const vector<Type*>& types)
{
	MovePtr<TestCaseGroup> group(new TestCaseGroup(testCtx, spec.name, spec.name));

	for (vector<Type*>::const_iterator it = types.begin(); it != types.end(); ++it)
	{
		Type& type = **it;
		const char* name = type.getName();
		if (!spec.needBind || type.binder() != DE_NULL)
			group->addChild(new LifeTest(name, name, type, spec.func));
	}

	return group;
}